

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O0

Vec_Ptr_t * Llb_ManComputeCutLi(Aig_Man_t *p)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  Vec_Ptr_t *p_01;
  Aig_Obj_t *pAVar2;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vMinCut;
  Aig_Man_t *p_local;
  
  iVar1 = Saig_ManPoNum(p);
  if (iVar1 == 0) {
    p_01 = Vec_PtrAlloc(100);
    Aig_ManIncrementTravId(p);
    for (local_24 = 0; iVar1 = Saig_ManRegNum(p), local_24 < iVar1; local_24 = local_24 + 1) {
      p_00 = p->vCos;
      iVar1 = Saig_ManPoNum(p);
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p_00,local_24 + iVar1);
      pAVar2 = Aig_ObjFanin0(pAVar2);
      iVar1 = Aig_ObjIsConst1(pAVar2);
      if ((iVar1 == 0) && (iVar1 = Aig_ObjIsTravIdCurrent(p,pAVar2), iVar1 == 0)) {
        Aig_ObjSetTravIdCurrent(p,pAVar2);
        Vec_PtrPush(p_01,pAVar2);
      }
    }
    return p_01;
  }
  __assert_fail("Saig_ManPoNum(p) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Flow.c"
                ,0x44e,"Vec_Ptr_t *Llb_ManComputeCutLi(Aig_Man_t *)");
}

Assistant:

Vec_Ptr_t * Llb_ManComputeCutLi( Aig_Man_t * p )
{
    Vec_Ptr_t * vMinCut;
    Aig_Obj_t * pObj;
    int i;
    assert( Saig_ManPoNum(p) == 0 );
    vMinCut = Vec_PtrAlloc( 100 );
    Aig_ManIncrementTravId(p);
    Saig_ManForEachLi( p, pObj, i )
    {
        pObj = Aig_ObjFanin0(pObj);
        if ( Aig_ObjIsConst1(pObj) )
            continue;
        if ( Aig_ObjIsTravIdCurrent(p, pObj) )
            continue;
        Aig_ObjSetTravIdCurrent(p, pObj);
        Vec_PtrPush( vMinCut, pObj );
    }
    return vMinCut;
}